

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InversionTypesSectionParser.cpp
# Opt level: O3

void __thiscall
OpenMD::InversionTypesSectionParser::parseLine
          (InversionTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  int iVar1;
  InversionType *inversionType;
  InversionTypeParser itParser;
  string remainder;
  string at4;
  string at3;
  string at2;
  string at1;
  StringTokenizer tokenizer;
  undefined1 local_148 [48];
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  StringTokenizer local_78;
  
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_78,line,(string *)local_148);
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  InversionTypeParser::InversionTypeParser((InversionTypeParser *)local_148);
  iVar1 = StringTokenizer::countTokens(&local_78);
  if (iVar1 < 5) {
    snprintf(painCave.errMsg,2000,
             "InversionTypesSectionParser Error: Not enough tokens at line %d\n",(ulong)(uint)lineNo
            );
    painCave.isFatal = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_(&local_98,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_b8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_d8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_(&local_f8,&local_78);
    StringTokenizer::getRemainingString_abi_cxx11_(&local_118,&local_78);
    inversionType = InversionTypeParser::parseLine((InversionTypeParser *)local_148,&local_118);
    if (inversionType != (InversionType *)0x0) {
      ForceField::addInversionType(ff,&local_98,&local_b8,&local_d8,&local_f8,inversionType);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::InversionTypeParser::InversionTypeEnum>_>_>
               *)local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.delim_._M_dataplus._M_p != &local_78.delim_.field_2) {
    operator_delete(local_78.delim_._M_dataplus._M_p,
                    local_78.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.tokenString_._M_dataplus._M_p != &local_78.tokenString_.field_2) {
    operator_delete(local_78.tokenString_._M_dataplus._M_p,
                    local_78.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void InversionTypesSectionParser::parseLine(ForceField& ff,
                                              const std::string& line,
                                              int lineNo) {
    StringTokenizer tokenizer(line);
    InversionTypeParser itParser;
    InversionType* inversionType = NULL;

    int nTokens = tokenizer.countTokens();

    if (nTokens < 5) {
      snprintf(
          painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
          "InversionTypesSectionParser Error: Not enough tokens at line %d\n",
          lineNo);
      painCave.isFatal = 1;
      simError();
      return;
    }

    std::string at1       = tokenizer.nextToken();
    std::string at2       = tokenizer.nextToken();
    std::string at3       = tokenizer.nextToken();
    std::string at4       = tokenizer.nextToken();
    std::string remainder = tokenizer.getRemainingString();

    try {
      inversionType = itParser.parseLine(remainder);
    } catch (OpenMDException& e) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "InversionTypesSectionParser Error: %s "
               "at line %d\n",
               e.what(), lineNo);
      painCave.isFatal = 1;
      simError();
    }

    if (inversionType != NULL) {
      ff.addInversionType(at1, at2, at3, at4, inversionType);
    }
  }